

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res012.c
# Opt level: O2

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  long *__ptr;
  long lVar3;
  ulong uVar4;
  long lVar5;
  vorbis_info_residue0 *info;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int ret;
  uint uVar9;
  
  __ptr = (long *)calloc(1,0x520);
  pvVar1 = vi->codec_setup;
  lVar3 = oggpack_read(opb,0x18);
  *__ptr = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  __ptr[1] = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  *(int *)(__ptr + 2) = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,6);
  uVar7 = (int)lVar3 + 1;
  *(uint *)((long)__ptr + 0x14) = uVar7;
  lVar3 = oggpack_read(opb,8);
  *(int *)(__ptr + 3) = (int)lVar3;
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  uVar7 = 0;
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    uVar4 = oggpack_read(opb,3);
    lVar5 = oggpack_read(opb,1);
    if (lVar5 != 0) {
      lVar5 = oggpack_read(opb,5);
      uVar4 = uVar4 | lVar5 << 3;
    }
    *(int *)((long)__ptr + uVar6 * 4 + 0x1c) = (int)uVar4;
    iVar2 = 0;
    while (uVar9 = (uint)uVar4, uVar9 != 0) {
      iVar2 = iVar2 + (uVar9 & 1);
      uVar4 = (ulong)(uVar9 >> 1);
    }
    uVar7 = uVar7 + iVar2;
  }
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    lVar5 = oggpack_read(opb,8);
    *(int *)((long)__ptr + uVar6 * 4 + 0x11c) = (int)lVar5;
  }
  iVar2 = *(int *)((long)pvVar1 + 0x24);
  if ((int)lVar3 < iVar2) {
    uVar6 = 0;
    do {
      if (uVar8 == uVar6) {
        return __ptr;
      }
      lVar3 = uVar6 * 4;
      uVar6 = uVar6 + 1;
    } while (*(int *)((long)__ptr + lVar3 + 0x11c) < iVar2);
  }
  free(__ptr);
  return (vorbis_info_residue *)0x0;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    if(oggpack_read(opb,1))
      cascade|=(oggpack_read(opb,5)<<3);
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++)
    info->booklist[j]=oggpack_read(opb,8);

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++)
    if(info->booklist[j]>=ci->books)goto errout;

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}